

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray-png.cxx
# Opt level: O0

void testSaveLoad<(andres::CoordinateOrder)0,(andres::CoordinateOrder)1>(void)

{
  reference puVar1;
  CoordinateOrder *pCVar2;
  size_t sVar3;
  bool local_100;
  bool local_ff;
  bool local_fe;
  bool local_fd;
  bool local_fc;
  bool local_fb;
  bool local_fa;
  allocator<unsigned_char> local_f9;
  CoordinateOrder local_f8;
  uchar local_f1;
  undefined1 local_f0 [8];
  Marray<unsigned_char,_std::allocator<unsigned_long>_> m_1;
  CoordinateOrder local_a0;
  uchar local_99;
  undefined1 local_98 [8];
  Marray<unsigned_char,_std::allocator<unsigned_long>_> m;
  allocator<char> local_39;
  undefined1 local_38 [8];
  string fileName;
  size_t shape [2];
  
  fileName.field_2._8_8_ = 2;
  shape[0] = 3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_38,"test.png",&local_39);
  std::allocator<char>::~allocator(&local_39);
  local_99 = '\0';
  local_a0 = FirstMajorOrder;
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)&m_1.field_0x47);
  andres::Marray<unsigned_char,std::allocator<unsigned_long>>::Marray<unsigned_long_const*>
            ((Marray<unsigned_char,std::allocator<unsigned_long>> *)local_98,
             (unsigned_long *)(fileName.field_2._M_local_buf + 8),shape + 1,&local_99,&local_a0,
             (allocator_type *)&m_1.field_0x47);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)&m_1.field_0x47);
  puVar1 = andres::View<unsigned_char,false,std::allocator<unsigned_long>>::operator()
                     ((View<unsigned_char,false,std::allocator<unsigned_long>> *)local_98,0,0);
  *puVar1 = '\x7f';
  puVar1 = andres::View<unsigned_char,false,std::allocator<unsigned_long>>::operator()
                     ((View<unsigned_char,false,std::allocator<unsigned_long>> *)local_98,0,2);
  *puVar1 = 0xff;
  puVar1 = andres::View<unsigned_char,false,std::allocator<unsigned_long>>::operator()
                     ((View<unsigned_char,false,std::allocator<unsigned_long>> *)local_98,1,0);
  *puVar1 = 200;
  andres::png::save<unsigned_char>
            ((string *)local_38,(Marray<unsigned_char,_std::allocator<unsigned_long>_> *)local_98);
  andres::Marray<unsigned_char,_std::allocator<unsigned_long>_>::~Marray
            ((Marray<unsigned_char,_std::allocator<unsigned_long>_> *)local_98);
  local_f1 = '\0';
  local_f8 = LastMajorOrder;
  std::allocator<unsigned_char>::allocator(&local_f9);
  andres::Marray<unsigned_char,_std::allocator<unsigned_long>_>::Marray
            ((Marray<unsigned_char,_std::allocator<unsigned_long>_> *)local_f0,&local_f1,&local_f8,
             &local_f9);
  std::allocator<unsigned_char>::~allocator(&local_f9);
  andres::png::load<unsigned_char>
            ((string *)local_38,(Marray<unsigned_char,_std::allocator<unsigned_long>_> *)local_f0);
  pCVar2 = andres::View<unsigned_char,_false,_std::allocator<unsigned_long>_>::coordinateOrder
                     ((View<unsigned_char,_false,_std::allocator<unsigned_long>_> *)local_f0);
  local_fa = *pCVar2 == LastMajorOrder;
  test(&local_fa);
  sVar3 = andres::View<unsigned_char,_false,_std::allocator<unsigned_long>_>::dimension
                    ((View<unsigned_char,_false,_std::allocator<unsigned_long>_> *)local_f0);
  local_fb = sVar3 == 2;
  test(&local_fb);
  sVar3 = andres::View<unsigned_char,_false,_std::allocator<unsigned_long>_>::shape
                    ((View<unsigned_char,_false,_std::allocator<unsigned_long>_> *)local_f0,0);
  local_fc = sVar3 == fileName.field_2._8_8_;
  test(&local_fc);
  sVar3 = andres::View<unsigned_char,_false,_std::allocator<unsigned_long>_>::shape
                    ((View<unsigned_char,_false,_std::allocator<unsigned_long>_> *)local_f0,1);
  local_fd = sVar3 == shape[0];
  test(&local_fd);
  puVar1 = andres::View<unsigned_char,false,std::allocator<unsigned_long>>::operator()
                     ((View<unsigned_char,false,std::allocator<unsigned_long>> *)local_f0,0,0);
  local_fe = *puVar1 == '\x7f';
  test(&local_fe);
  puVar1 = andres::View<unsigned_char,false,std::allocator<unsigned_long>>::operator()
                     ((View<unsigned_char,false,std::allocator<unsigned_long>> *)local_f0,0,2);
  local_ff = *puVar1 == 0xff;
  test(&local_ff);
  puVar1 = andres::View<unsigned_char,false,std::allocator<unsigned_long>>::operator()
                     ((View<unsigned_char,false,std::allocator<unsigned_long>> *)local_f0,1,0);
  local_100 = *puVar1 == 200;
  test(&local_100);
  andres::Marray<unsigned_char,_std::allocator<unsigned_long>_>::~Marray
            ((Marray<unsigned_char,_std::allocator<unsigned_long>_> *)local_f0);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void testSaveLoad() {
    size_t const shape[] = {2, 3};
    std::string const fileName = "test.png";
    {
        andres::Marray<unsigned char> m(shape, shape + 2, 0, ORDER_SAVE);
        m(0, 0) = 127;
        m(0, 2) = 255;
        m(1, 0) = 200;
        andres::png::save(fileName, m);
    }
    {
        andres::Marray<unsigned char> m(0, ORDER_LOAD);
        andres::png::load(fileName, m);
        test(m.coordinateOrder() == ORDER_LOAD);
        test(m.dimension() == 2);
        test(m.shape(0) == shape[0]);
        test(m.shape(1) == shape[1]);
        test(m(0, 0) == 127);
        test(m(0, 2) == 255);
        test(m(1, 0) == 200);
    }
}